

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

void Abs_ManFreeAray(Vec_Ptr_t *p)

{
  int iVar1;
  void *__ptr;
  int local_1c;
  int i;
  void *pTemp;
  Vec_Ptr_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p), local_1c < iVar1; local_1c = local_1c + 1) {
    __ptr = Vec_PtrEntry(p,local_1c);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abs_ManFreeAray( Vec_Ptr_t * p )
{
    void * pTemp;
    int i;
    Vec_PtrForEachEntry( void *, p, pTemp, i )
        ABC_FREE( pTemp );
    Vec_PtrFree( p );
}